

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SGDOptimizer::MergeFrom(SGDOptimizer *this,SGDOptimizer *from)

{
  bool bVar1;
  LogMessage *other;
  Int64Parameter *this_00;
  Int64Parameter *from_00;
  DoubleParameter *pDVar2;
  DoubleParameter *pDVar3;
  InternalMetadataWithArenaLite *this_01;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  SGDOptimizer *local_58;
  SGDOptimizer *from_local;
  SGDOptimizer *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1243b);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_01 = &this->_internal_metadata_;
  this_local = (SGDOptimizer *)&local_58->_internal_metadata_;
  local_40 = this_01;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_01,&local_20->unknown_fields);
  }
  bVar1 = has_learningrate(local_58);
  if (bVar1) {
    pDVar2 = mutable_learningrate(this);
    pDVar3 = learningrate(local_58);
    DoubleParameter::MergeFrom(pDVar2,pDVar3);
  }
  bVar1 = has_minibatchsize(local_58);
  if (bVar1) {
    this_00 = mutable_minibatchsize(this);
    from_00 = minibatchsize(local_58);
    Int64Parameter::MergeFrom(this_00,from_00);
  }
  bVar1 = has_momentum(local_58);
  if (bVar1) {
    pDVar2 = mutable_momentum(this);
    pDVar3 = momentum(local_58);
    DoubleParameter::MergeFrom(pDVar2,pDVar3);
  }
  return;
}

Assistant:

void SGDOptimizer::MergeFrom(const SGDOptimizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SGDOptimizer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_learningrate()) {
    mutable_learningrate()->::CoreML::Specification::DoubleParameter::MergeFrom(from.learningrate());
  }
  if (from.has_minibatchsize()) {
    mutable_minibatchsize()->::CoreML::Specification::Int64Parameter::MergeFrom(from.minibatchsize());
  }
  if (from.has_momentum()) {
    mutable_momentum()->::CoreML::Specification::DoubleParameter::MergeFrom(from.momentum());
  }
}